

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O1

VertexAlignment *
s2polyline_alignment::AlignmentFn
          (VertexAlignment *__return_storage_ptr__,S2Polyline *a,S2Polyline *b,bool approx)

{
  int iVar1;
  undefined7 in_register_00000009;
  double dVar2;
  
  if ((int)CONCAT71(in_register_00000009,approx) == 0) {
    GetExactVertexAlignment(__return_storage_ptr__,a,b);
  }
  else {
    iVar1 = b->num_vertices_;
    if (b->num_vertices_ < a->num_vertices_) {
      iVar1 = a->num_vertices_;
    }
    dVar2 = pow((double)iVar1,0.25);
    GetApproxVertexAlignment(__return_storage_ptr__,a,b,(int)dVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

VertexAlignment AlignmentFn(const S2Polyline& a, const S2Polyline& b,
                            bool approx) {
  return approx ? GetApproxVertexAlignment(a, b)
                : GetExactVertexAlignment(a, b);
}